

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double IF97::BackwardOutputHS(IF97parameters outkey,double h,double s)

{
  int iVar1;
  IF97BACKREGIONS IVar2;
  invalid_argument *this;
  out_of_range *poVar3;
  double dStack_48;
  IF97BACKREGIONS region;
  double Tval;
  double Pval;
  double s_local;
  double h_local;
  double dStack_10;
  IF97parameters outkey_local;
  
  if ((BackwardOutputHS(IF97parameters,double,double)::B1HS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B1HS), iVar1 != 0
     )) {
    Backwards::Region1HS::Region1HS(&BackwardOutputHS::B1HS);
    __cxa_atexit(Backwards::Region1HS::~Region1HS,&BackwardOutputHS::B1HS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B1HS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2aHS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2aHS),
     iVar1 != 0)) {
    Backwards::Region2aHS::Region2aHS(&BackwardOutputHS::B2aHS);
    __cxa_atexit(Backwards::Region2aHS::~Region2aHS,&BackwardOutputHS::B2aHS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2bHS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2bHS),
     iVar1 != 0)) {
    Backwards::Region2bHS::Region2bHS(&BackwardOutputHS::B2bHS);
    __cxa_atexit(Backwards::Region2bHS::~Region2bHS,&BackwardOutputHS::B2bHS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B2cHS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B2cHS),
     iVar1 != 0)) {
    Backwards::Region2cHS::Region2cHS(&BackwardOutputHS::B2cHS);
    __cxa_atexit(Backwards::Region2cHS::~Region2cHS,&BackwardOutputHS::B2cHS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B2cHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3aHS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3aHS),
     iVar1 != 0)) {
    Backwards::Region3aHS::Region3aHS(&BackwardOutputHS::B3aHS);
    __cxa_atexit(Backwards::Region3aHS::~Region3aHS,&BackwardOutputHS::B3aHS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3aHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B3bHS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B3bHS),
     iVar1 != 0)) {
    Backwards::Region3bHS::Region3bHS(&BackwardOutputHS::B3bHS);
    __cxa_atexit(Backwards::Region3bHS::~Region3bHS,&BackwardOutputHS::B3bHS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B3bHS);
  }
  if ((BackwardOutputHS(IF97parameters,double,double)::B4HS == '\0') &&
     (iVar1 = __cxa_guard_acquire(&BackwardOutputHS(IF97parameters,double,double)::B4HS), iVar1 != 0
     )) {
    Backwards::Region4HS::Region4HS(&BackwardOutputHS::B4HS);
    __cxa_atexit(Backwards::Region4HS::~Region4HS,&BackwardOutputHS::B4HS,&__dso_handle);
    __cxa_guard_release(&BackwardOutputHS(IF97parameters,double,double)::B4HS);
  }
  if ((outkey != IF97_P) && (outkey != IF97_T)) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"Backward HS Formulas output Temperature or Pressure only.");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  IVar2 = RegionDetermination_HS(h,s);
  switch(IVar2) {
  case BACK_1:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B1HS.super_BackwardsRegion,h,s);
    break;
  case BACK_2A:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B2aHS.super_BackwardsRegion,h,s);
    break;
  case BACK_2B:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B2bHS.super_BackwardsRegion,h,s);
    break;
  case BACK_2C:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B2cHS.super_BackwardsRegion,h,s);
    break;
  case BACK_3A:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B3aHS.super_BackwardsRegion,h,s);
    break;
  case BACK_3B:
    Tval = Backwards::BackwardsRegion::p_hs(&BackwardOutputHS::B3bHS.super_BackwardsRegion,h,s);
    break;
  case BACK_4:
    if (s < 5.210887825) {
      poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar3,"Entropy out of range");
      __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    dStack_48 = Backwards::BackwardsRegion::t_hs(&BackwardOutputHS::B4HS.super_BackwardsRegion,h,s);
    break;
  default:
    poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar3,"Unable to match region");
    __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (outkey == IF97_P) {
    if (IVar2 == BACK_4) {
      dStack_10 = psat97(dStack_48);
    }
    else {
      dStack_10 = Tval;
    }
  }
  else if (IVar2 == BACK_4) {
    dStack_10 = dStack_48;
  }
  else {
    dStack_10 = RegionOutputBackward(Tval,h,IF97_HMASS,false,NONE);
  }
  return dStack_10;
}

Assistant:

inline double BackwardOutputHS(IF97parameters outkey,double h, double s){
        // Note that this routine returns only temperature (IF97_T).  All other values should be
        // calculated from this temperature and the known pressure using forward equations.
        // Setup Backward Regions for output
        static Backwards::Region1HS B1HS;
        static Backwards::Region2aHS B2aHS;
        static Backwards::Region2bHS B2bHS;
        static Backwards::Region2cHS B2cHS;
        static Backwards::Region3aHS B3aHS;
        static Backwards::Region3bHS B3bHS;
        static Backwards::Region4HS B4HS;
        //
        double Pval, Tval;

        // Make sure output keys are valid for Backward_HS formulas
        if ((outkey != IF97_P) && (outkey != IF97_T))
            throw std::invalid_argument("Backward HS Formulas output Temperature or Pressure only.");

        // Get Saturation Parameters

        IF97BACKREGIONS region = RegionDetermination_HS(h, s);

        switch (region){
        case BACK_1:   Pval = B1HS.p_hs(h,s);  break;
        case BACK_2A:  Pval = B2aHS.p_hs(h,s); break;
        case BACK_2B:  Pval = B2bHS.p_hs(h,s); break;
        case BACK_2C:  Pval = B2cHS.p_hs(h,s); break;
        case BACK_3A:  Pval = B3aHS.p_hs(h,s); break;
        case BACK_3B:  Pval = B3bHS.p_hs(h,s); break;
        case BACK_4:   if (s >= SgT23)   // T(h,s) only defined over part of the 2-phase region
                           Tval = B4HS.t_hs(h,s);
                       else
                           throw std::out_of_range("Entropy out of range");
                       break;
        default: throw std::out_of_range("Unable to match region");
        }
        if (outkey == IF97_P)            // Returning Pressure (IF97_P)
            if (region == BACK_4)        //
                return psat97(Tval);     //       Not REGION 4, already have pressure
            else                         // 
                return Pval;             //       REGION 4, Calculate Psat from Tsat
                                         //
        else                             // ELSE Returning Temperature
            if (region == BACK_4)        //
                return Tval;                                     // REGION 4, already have Temperature
            else                                                 //
                return RegionOutputBackward(Pval,h,IF97_HMASS,false,NONE);  // Not REGION 4 Calc from Backward T(p,h)
    }